

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O1

void TranslateModuleGlobalVariables(ExpressionTranslateContext *ctx)

{
  VariableData *variable;
  bool bVar1;
  ExpressionContext *pEVar2;
  _func_int **pp_Var3;
  ScopeData *pSVar4;
  TypeBase *pTVar5;
  char *pcVar6;
  char cVar7;
  ulong uVar8;
  InplaceStr local_50;
  InplaceStr local_40;
  
  PrintIndentedLine(ctx,"// Global variables");
  pEVar2 = ctx->ctx;
  if ((pEVar2->variables).count != 0) {
    uVar8 = 0;
    do {
      variable = (pEVar2->variables).data[uVar8];
      if ((variable->isVmAlloca == false) && (pTVar5 = variable->type, pTVar5 != pEVar2->typeVoid))
      {
        if ((pTVar5 == (TypeBase *)0x0) || (pTVar5->typeID != 0x12)) {
          pTVar5 = (TypeBase *)0x0;
        }
        if (pTVar5 == (TypeBase *)0x0) {
LAB_0015bb25:
          cVar7 = '\0';
        }
        else {
          pp_Var3 = pTVar5[1]._vptr_TypeBase;
          if ((pp_Var3 == (_func_int **)0x0) || (*(int *)(pp_Var3 + 1) != 0x18)) {
            pp_Var3 = (_func_int **)0x0;
          }
          if (pp_Var3 == (_func_int **)0x0) goto LAB_0015bb25;
          cVar7 = *(char *)((long)pp_Var3 + 0x121);
        }
        if (variable->importModule == (ModuleData *)0x0) {
          pcVar6 = (variable->name->name).begin;
          if (4 < (uint)(*(int *)&(variable->name->name).end - (int)pcVar6)) {
            local_40.end = pcVar6 + 5;
            local_50.begin = "$temp";
            local_50.end = "";
            local_40.begin = pcVar6;
            bVar1 = InplaceStr::operator==(&local_40,&local_50);
            pcVar6 = "static ";
            if (bVar1) goto LAB_0015bbcc;
          }
          pSVar4 = variable->scope;
          if ((pSVar4 == ctx->ctx->globalScope) || (pSVar4->ownerNamespace != (NamespaceData *)0x0))
          {
            pcVar6 = "static ";
            if (cVar7 != '\0') goto LAB_0015bbcc;
          }
          else {
            pSVar4 = ExpressionContext::GlobalScopeFrom(ctx->ctx,pSVar4);
            pcVar6 = "static ";
            if (pSVar4 == (ScopeData *)0x0) goto LAB_0015bc1c;
LAB_0015bbcc:
            Print(ctx,pcVar6);
          }
          TranslateTypeName(ctx,variable->type);
          Print(ctx," ");
          TranslateVariableName(ctx,variable);
          Print(ctx,";");
          OutputContext::Print(ctx->output,"\n",1);
        }
        else {
          pcVar6 = "extern ";
          if (cVar7 == '\0') goto LAB_0015bbcc;
        }
      }
LAB_0015bc1c:
      uVar8 = uVar8 + 1;
      pEVar2 = ctx->ctx;
    } while (uVar8 < (pEVar2->variables).count);
  }
  OutputContext::Print(ctx->output,"\n",1);
  return;
}

Assistant:

void TranslateModuleGlobalVariables(ExpressionTranslateContext &ctx)
{
	PrintIndentedLine(ctx, "// Global variables");

	for(unsigned int i = 0; i < ctx.ctx.variables.size(); i++)
	{
		VariableData *variable = ctx.ctx.variables[i];

		// Don't need variables allocated by intermediate vm compilation
		if(variable->isVmAlloca)
			continue;

		if(variable->type == ctx.ctx.typeVoid)
			continue;

		bool isInternalFunctionContext = false;

		if(TypeRef *typeRef = getType<TypeRef>(variable->type))
		{
			if(TypeClass *typeClass = getType<TypeClass>(typeRef->subType))
				isInternalFunctionContext = typeClass->isInternal;
		}

		InplaceStr name = variable->name->name;

		if(variable->importModule)
		{
			// Skip internal function context
			if(isInternalFunctionContext)
				continue;

			Print(ctx, "extern ");
			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(name.length() >= 5 && InplaceStr(name.begin, name.begin + 5) == InplaceStr("$temp"))
		{
			Print(ctx, "static ");
			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(variable->scope == ctx.ctx.globalScope || variable->scope->ownerNamespace)
		{
			// Do not export internal function context
			if(isInternalFunctionContext)
				Print(ctx, "static ");

			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
		else if(ctx.ctx.GlobalScopeFrom(variable->scope))
		{
			Print(ctx, "static ");
			TranslateTypeName(ctx, variable->type);
			Print(ctx, " ");
			TranslateVariableName(ctx, variable);
			Print(ctx, ";");
			PrintLine(ctx);
		}
	}

	PrintLine(ctx);
}